

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O3

TonkConnectionConfig *
tonk::SDKSocket::MakeConnectionConfig
          (TonkConnectionConfig *__return_storage_ptr__,SDKConnection *sdkConnection)

{
  __return_storage_ptr__->AppContextPtr = sdkConnection;
  __return_storage_ptr__->OnConnect = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  __return_storage_ptr__->OnTick = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  __return_storage_ptr__->OnData = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  __return_storage_ptr__->OnClose = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  return __return_storage_ptr__;
}

Assistant:

TonkConnectionConfig SDKSocket::MakeConnectionConfig(SDKConnection* sdkConnection)
{
    TonkConnectionConfig config;
    config.AppContextPtr = reinterpret_cast<TonkAppContextPtr>(sdkConnection);

    config.OnConnect = [](
        TonkAppContextPtr context,
        TonkConnection /*connection*/)
    {
        SDKConnection* conn = (SDKConnection*)context;
        conn->OnConnect();
    };
    config.OnTick = [](
        TonkAppContextPtr context,
        TonkConnection /*connection*/,
        uint64_t nowUsec)
    {
        SDKConnection* conn = (SDKConnection*)context;
        conn->OnTick(nowUsec);
    };
    config.OnData = [](
        TonkAppContextPtr context,
        TonkConnection /*connection*/,
        uint32_t channel,
        const uint8_t* data,
        uint32_t bytes)
    {
        SDKConnection* conn = (SDKConnection*)context;
        conn->OnData(channel, data, bytes);
    };
    config.OnClose = [](
        TonkAppContextPtr context,
        TonkConnection /*connection*/,
        TonkResult reason,
        const char* reasonJson)
    {
        SDKConnection* conn = (SDKConnection*)context;
        SDKJsonResult result;
        result.ErrorJson = reasonJson;
        result.Result = reason;
        conn->OnClose(result);

        // Release self-reference here, allowing object to go out of scope.
        conn->SelfReference.reset();
    };

    return config;
}